

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int run_with_handle(function<int_(_qpdfjob_handle_*)> *fn)

{
  int local_1c;
  qpdfjob_handle p_Stack_18;
  int status;
  qpdfjob_handle j;
  function<int_(_qpdfjob_handle_*)> *fn_local;
  
  j = (qpdfjob_handle)fn;
  p_Stack_18 = qpdfjob_init();
  local_1c = std::function<int_(_qpdfjob_handle_*)>::operator()(fn,p_Stack_18);
  if (local_1c == 0) {
    local_1c = qpdfjob_run(p_Stack_18);
  }
  qpdfjob_cleanup(&stack0xffffffffffffffe8);
  return local_1c;
}

Assistant:

static int
run_with_handle(std::function<int(qpdfjob_handle)> fn)
{
    auto j = qpdfjob_init();
    int status = fn(j);
    if (status == 0) {
        status = qpdfjob_run(j);
    }
    qpdfjob_cleanup(&j);
    return status;
}